

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O3

void __thiscall
Minisat::Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::percolateUp
          (Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_> *this,int i)

{
  uint uVar1;
  Var x;
  int iVar2;
  bool bVar3;
  Var *pVVar4;
  int iVar5;
  
  pVVar4 = (this->heap).data;
  x = pVVar4[i];
  if (i == 0) {
    iVar5 = 0;
  }
  else {
    do {
      uVar1 = i - 1;
      iVar5 = (int)uVar1 >> 1;
      bVar3 = Solver::VarOrderLt::operator()(&this->lt,x,pVVar4[iVar5]);
      pVVar4 = (this->heap).data;
      if (!bVar3) {
        pVVar4 = pVVar4 + i;
        iVar5 = i;
        break;
      }
      iVar2 = pVVar4[iVar5];
      pVVar4[i] = iVar2;
      if ((this->indices).map.sz <= iVar2) goto LAB_001113d3;
      (this->indices).map.data[iVar2] = i;
      i = iVar5;
    } while (1 < uVar1);
  }
  *pVVar4 = x;
  if (x < (this->indices).map.sz) {
    (this->indices).map.data[x] = iVar5;
    return;
  }
LAB_001113d3:
  __assert_fail("has(k)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/mtl/IntMap.h"
                ,0x28,
                "V &Minisat::IntMap<int, int>::operator[](K) [K = int, V = int, MkIndex = Minisat::MkIndexDefault<int>]"
               );
}

Assistant:

void percolateUp(int i)
    {
        K   x  = heap[i];
        int p  = parent(i);
        
        while (i != 0 && lt(x, heap[p])){
            heap[i]          = heap[p];
            indices[heap[p]] = i;
            i                = p;
            p                = parent(p);
        }
        heap   [i] = x;
        indices[x] = i;
    }